

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor.cpp
# Opt level: O2

void __thiscall duckdb::ExpressionExecutor::AddExpression(ExpressionExecutor *this,Expression *expr)

{
  type state_00;
  pointer this_00;
  templated_unique_single_t state;
  unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>_>
  local_20;
  
  local_20._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionExecutorState_*,_std::default_delete<duckdb::ExpressionExecutorState>_>
  .super__Head_base<0UL,_duckdb::ExpressionExecutorState_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true,_true>
        )(__uniq_ptr_data<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true,_true>
          )expr;
  ::std::vector<duckdb::Expression_const*,std::allocator<duckdb::Expression_const*>>::
  emplace_back<duckdb::Expression_const*>
            ((vector<duckdb::Expression_const*,std::allocator<duckdb::Expression_const*>> *)this,
             (Expression **)&local_20);
  make_uniq<duckdb::ExpressionExecutorState>();
  state_00 = unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
             ::operator*((unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
                          *)&local_20);
  Initialize(this,expr,state_00);
  this_00 = unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
            ::operator->((unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
                          *)&local_20);
  ExpressionExecutorState::Verify(this_00);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>>>
              *)&this->states,
             (unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
              *)&local_20);
  ::std::
  unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

void ExpressionExecutor::AddExpression(const Expression &expr) {
	expressions.push_back(&expr);
	auto state = make_uniq<ExpressionExecutorState>();
	Initialize(expr, *state);
	state->Verify();
	states.push_back(std::move(state));
}